

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

void gen_VNMUL_dp(TCGContext_conflict1 *tcg_ctx,TCGv_i64 vd,TCGv_i64 vn,TCGv_i64 vm,TCGv_ptr fpst)

{
  TCGv_ptr fpst_local;
  TCGv_i64 vm_local;
  TCGv_i64 vn_local;
  TCGv_i64 vd_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  gen_helper_vfp_muld(tcg_ctx,vd,vn,vm,fpst);
  gen_helper_vfp_negd(tcg_ctx,vd,vd);
  return;
}

Assistant:

static void gen_VNMUL_dp(TCGContext *tcg_ctx, TCGv_i64 vd, TCGv_i64 vn, TCGv_i64 vm, TCGv_ptr fpst)
{
    /* VNMUL: -(fn * fm) */
    gen_helper_vfp_muld(tcg_ctx, vd, vn, vm, fpst);
    gen_helper_vfp_negd(tcg_ctx, vd, vd);
}